

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_filter.cpp
# Opt level: O2

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::InFilter::Copy(InFilter *this)

{
  _func_int **in_RAX;
  long in_RSI;
  _func_int **local_18;
  
  local_18 = in_RAX;
  make_uniq<duckdb::InFilter,duckdb::vector<duckdb::Value,true>const&>
            ((duckdb *)&local_18,(vector<duckdb::Value,_true> *)(in_RSI + 0x10));
  (this->super_TableFilter)._vptr_TableFilter = local_18;
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> InFilter::Copy() const {
	return make_uniq<InFilter>(values);
}